

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>
::
FlatTupleBase<solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData>
          (FlatTupleBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData,solitaire::colliders::UncoveredPileCardsPositionData>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>
           *this,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5,
          undefined8 param_6)

{
  UncoveredPileCardsPositionData *args_local_4;
  UncoveredPileCardsPositionData *args_local_3;
  UncoveredPileCardsPositionData *args_local_2;
  UncoveredPileCardsPositionData *args_local_1;
  UncoveredPileCardsPositionData *args_local;
  FlatTupleBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>
  *this_local;
  
  FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_0UL>
  ::FlatTupleElemBase<solitaire::colliders::UncoveredPileCardsPositionData>
            ((FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_0UL>
              *)this,param_2);
  FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_1UL>
  ::FlatTupleElemBase<solitaire::colliders::UncoveredPileCardsPositionData>
            ((FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_1UL>
              *)(this + 0x10),param_3);
  FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_2UL>
  ::FlatTupleElemBase<solitaire::colliders::UncoveredPileCardsPositionData>
            ((FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_2UL>
              *)(this + 0x20),param_4);
  FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_3UL>
  ::FlatTupleElemBase<solitaire::colliders::UncoveredPileCardsPositionData>
            ((FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_3UL>
              *)(this + 0x30),param_5);
  FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_4UL>
  ::FlatTupleElemBase<solitaire::colliders::UncoveredPileCardsPositionData>
            ((FlatTupleElemBase<testing::internal::FlatTuple<solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData,_solitaire::colliders::UncoveredPileCardsPositionData>,_4UL>
              *)(this + 0x40),param_6);
  return;
}

Assistant:

explicit FlatTupleBase(FlatTupleConstructTag, Args&&... args)
      : FlatTupleElemBase<FlatTuple<T...>, Idx>(FlatTupleConstructTag{},
                                                std::forward<Args>(args))... {}